

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

bool cmsys::SystemTools::GetEnv(char *key,string *result)

{
  char *pcVar1;
  char *__s;
  
  __s = getenv(key);
  if (__s != (char *)0x0) {
    pcVar1 = (char *)result->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)result,0,pcVar1,(ulong)__s);
  }
  return __s != (char *)0x0;
}

Assistant:

bool SystemTools::GetEnv(const char* key, kwsys_stl::string& result)
{
  const char* v = getenv(key);
  if(v)
    {
    result = v;
    return true;
    }
  else
    {
    return false;
    }
}